

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O2

char queryparse::transform_char(node *n)

{
  type_info *ptVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  runtime_error *this;
  string local_38;
  
  tao::pegtl::parse_tree::default_node_content::content_abi_cxx11_
            (&local_38,
             &(n->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content);
  ptVar1 = (n->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.id_;
  if (ptVar1 == (type_info *)&hexbyte::typeinfo) {
    iVar3 = hex2int(*local_38._M_dataplus._M_p);
    iVar4 = hex2int(local_38._M_dataplus._M_p[1]);
    bVar2 = (byte)iVar4 | (byte)(iVar3 << 4);
  }
  else if (ptVar1 == (type_info *)&ascii_char::typeinfo) {
    bVar2 = *local_38._M_dataplus._M_p;
  }
  else {
    if (ptVar1 != (type_info *)&escaped_char::typeinfo) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"unknown character parse");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = unescape_char(*local_38._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

char transform_char(const parse_tree::node &n) {
    const std::string &content = n.content();
    if (n.is<hexbyte>()) {
        return static_cast<char>((hex2int(content[0]) << 4) +
                                 hex2int(content[1]));
    }
    if (n.is<ascii_char>()) {
        return content[0];
    }
    if (n.is<escaped_char>()) {
        return unescape_char(content[0]);
    }
    throw std::runtime_error("unknown character parse");
}